

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::more(uint argc)

{
  CVmBif::check_argc(argc,0);
  if ((G_net_config_X == (TadsNetConfig *)0x0) &&
     ((G_console_X->super_CVmConsole).script_sp_ == (script_stack_entry *)0x0)) {
    (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])(G_console_X,0);
    (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[9])();
    return;
  }
  return;
}

Assistant:

void CVmBifTIO::more(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);

    /* ignore in web host mode */
    if (G_net_config != 0)
        return;

    /* 
     *   if we're reading from a script, ignore this request - these types of
     *   interactive pauses are irrelevant when reading a script, since we're
     *   getting our input non-interactively 
     */
    if (G_console->is_reading_script())
        return;

    /* flush the display output */
    G_console->flush_all(vmg_ VM_NL_NONE);

    /* show the MORE prompt */
    G_console->show_more_prompt(vmg0_);
}